

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O1

SRes LzmaEnc_Encode2(CLzmaEnc *p,ICompressProgressPtr progress)

{
  int iVar1;
  SRes SVar2;
  
  iVar1 = LzmaEnc_CodeOneBlock(p,0,0);
  while( true ) {
    if (iVar1 != 0) {
      return iVar1;
    }
    if (p->finished != 0) break;
    if ((progress != (ICompressProgressPtr)0x0) &&
       (SVar2 = (*progress->Progress)
                          (progress,p->nowPos64,
                           (UInt64)((p->rc).buf +
                                   (p->rc).cacheSize + ((p->rc).processed - (long)(p->rc).bufBase)))
       , SVar2 != 0)) {
      return 10;
    }
    iVar1 = LzmaEnc_CodeOneBlock(p,0,0);
  }
  return 0;
}

Assistant:

Z7_NO_INLINE
static SRes LzmaEnc_Encode2(CLzmaEnc *p, ICompressProgressPtr progress)
{
  SRes res = SZ_OK;

  #ifndef Z7_ST
  Byte allocaDummy[0x300];
  allocaDummy[0] = 0;
  allocaDummy[1] = allocaDummy[0];
  #endif

  for (;;)
  {
    res = LzmaEnc_CodeOneBlock(p, 0, 0);
    if (res != SZ_OK || p->finished)
      break;
    if (progress)
    {
      res = ICompressProgress_Progress(progress, p->nowPos64, RangeEnc_GetProcessed(&p->rc));
      if (res != SZ_OK)
      {
        res = SZ_ERROR_PROGRESS;
        break;
      }
    }
  }
  
  LzmaEnc_Finish((CLzmaEncHandle)(void *)p);

  /*
  if (res == SZ_OK && !Inline_MatchFinder_IsFinishedOK(&MFB))
    res = SZ_ERROR_FAIL;
  }
  */

  return res;
}